

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palrange.h
# Opt level: O0

Arena<void> __thiscall
snmalloc::PalRange<snmalloc::PALLinux>::alloc_range(PalRange<snmalloc::PALLinux> *this,size_t size)

{
  size_t sVar1;
  size_t in_RSI;
  size_t in_RDI;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  result;
  undefined8 local_38;
  
  sVar1 = bits::next_pow2_bits(in_RSI);
  if (sVar1 < 0x3f) {
    local_38 = PALLinux::reserve(in_RDI);
  }
  else {
    local_38 = (void *)0x0;
  }
  return (Arena<void>)local_38;
}

Assistant:

capptr::Arena<void> alloc_range(size_t size)
    {
      if (bits::next_pow2_bits(size) >= bits::BITS - 1)
      {
        return nullptr;
      }

      if constexpr (pal_supports<AlignedAllocation, PAL>)
      {
        SNMALLOC_ASSERT(size >= PAL::minimum_alloc_size);
        auto result = capptr::Arena<void>::unsafe_from(
          PAL::template reserve_aligned<false>(size));

#ifdef SNMALLOC_TRACING
        message<1024>("Pal range alloc: {} ({})", result.unsafe_ptr(), size);
#endif
        return result;
      }
      else
      {
        auto result = capptr::Arena<void>::unsafe_from(PAL::reserve(size));

#ifdef SNMALLOC_TRACING
        message<1024>("Pal range alloc: {} ({})", result.unsafe_ptr(), size);
#endif

        return result;
      }
    }